

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool Catch::compareEqual<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,wchar_t[6]>
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *lhs,wchar_t (*rhs) [6])

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __x;
  bool bVar1;
  size_t sVar2;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  
  __x = *lhs;
  sVar2 = wcslen(*rhs);
  __y._M_str = *rhs;
  __y._M_len = sVar2;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }